

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.h
# Opt level: O0

void __thiscall
Js::FunctionBodyPolymorphicInlineCache::FunctionBodyPolymorphicInlineCache
          (FunctionBodyPolymorphicInlineCache *this,InlineCache *inlineCaches,uint16 size,
          FunctionBody *functionBody)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *functionBody_local;
  uint16 size_local;
  InlineCache *inlineCaches_local;
  FunctionBodyPolymorphicInlineCache *this_local;
  
  PolymorphicInlineCache::PolymorphicInlineCache
            (&this->super_PolymorphicInlineCache,inlineCaches,size);
  (this->super_PolymorphicInlineCache).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01df39b8;
  this->functionBody = functionBody;
  this->next = (FunctionBodyPolymorphicInlineCache *)0x0;
  this->prev = (FunctionBodyPolymorphicInlineCache *)0x0;
  if (((size != 0) || (inlineCaches != (InlineCache *)0x0)) &&
     ((inlineCaches == (InlineCache *)0x0 || ((size < 4 || (0x20 < size)))))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InlineCache.h"
                                ,0x2ab,
                                "((size == 0 && inlineCaches == nullptr) || (inlineCaches != nullptr && size >= 4 && size <= 32))"
                                ,
                                "(size == 0 && inlineCaches == nullptr) || (inlineCaches != nullptr && size >= MinPolymorphicInlineCacheSize && size <= MaxPolymorphicInlineCacheSize)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

FunctionBodyPolymorphicInlineCache(InlineCache * inlineCaches, uint16 size, FunctionBody * functionBody)
            : PolymorphicInlineCache(inlineCaches, size), functionBody(functionBody), next(nullptr), prev(nullptr)
        {
            Assert((size == 0 && inlineCaches == nullptr) ||
                (inlineCaches != nullptr && size >= MinPolymorphicInlineCacheSize && size <= MaxPolymorphicInlineCacheSize));
        }